

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int fits_set_quantize_method(fitsfile *fptr,int method,int *status)

{
  int *in_RDX;
  int in_ESI;
  long in_RDI;
  undefined4 local_c;
  
  if ((in_ESI < -1) || (2 < in_ESI)) {
    ffpmsg((char *)0x1fedfb);
    *in_RDX = 0x19d;
  }
  else {
    local_c = in_ESI;
    if (in_ESI == 0) {
      local_c = 1;
    }
    *(int *)(*(long *)(in_RDI + 8) + 0x424) = local_c;
  }
  return *in_RDX;
}

Assistant:

int fits_set_quantize_method(fitsfile *fptr,  /* I - FITS file pointer   */
           int method,          /* quantization method       */
           int *status)         /* IO - error status                */
{
/*
   This routine specifies what type of dithering (randomization) should
   be performed when quantizing floating point images to integer prior to
   compression.   A value of -1 means do no dithering.  A value of 0 means
   use the default SUBTRACTIVE_DITHER_1 (which is equivalent to dither = 1).
   A value of 2 means use SUBTRACTIVE_DITHER_2.
*/

    if (method < -1 || method > 2)
    {
	ffpmsg("illegal dithering value (fits_set_quantize_method)");
	*status = DATA_COMPRESSION_ERR; 
    } else {
       
        if (method == 0) method = 1;
        (fptr->Fptr)->request_quantize_method = method;
    }

    return(*status);
}